

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O2

void __thiscall CEDate::CEDate(CEDate *this,vector<double,_std::allocator<double>_> *date)

{
  CEDateType local_3c;
  vector<double,_std::allocator<double>_> local_38;
  double local_20;
  
  this->_vptr_CEDate = (_func_int **)&PTR__CEDate_001417d8;
  std::vector<double,_std::allocator<double>_>::vector(&this->gregorian_date_vect_);
  this->return_type_ = JD;
  init_members(this);
  std::vector<double,_std::allocator<double>_>::vector(&local_38,date);
  local_20 = GregorianVect2Gregorian(&local_38);
  local_3c = GREGORIAN;
  SetDate(this,&local_20,&local_3c);
  std::vector<double,_std::allocator<double>_>::~vector(&local_38);
  return;
}

Assistant:

CEDate::CEDate(std::vector<double> date)
{
    init_members();
    // First get the gregorian date double from the vector, then set the date
    CEDate::SetDate(GregorianVect2Gregorian(date), CEDateType::GREGORIAN) ;
}